

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datamodel.cpp
# Opt level: O2

void __thiscall FSSDataModel::saveSetting(FSSDataModel *this,PSource *source)

{
  DataSourceType DVar1;
  QSettings settings;
  undefined1 local_90 [40];
  char *local_68 [4];
  QVariant local_48;
  __shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  QSettings::QSettings((QSettings *)(local_90 + 0x18),(QObject *)0x0);
  std::__shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_28,&source->super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>);
  DVar1 = getType((PSource *)&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  if (DVar1 == DataSourceTypeDos) {
    QString::QString((QString *)local_90,"sources/dos");
    (*((source->super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_Source
      [1])(local_68);
    QVariant::QVariant(&local_48,local_68[0]);
    QSettings::setValue((QString *)(local_90 + 0x18),(QVariant *)local_90);
  }
  else if (DVar1 == DataSourceTypeAmiga) {
    QString::QString((QString *)local_90,"sources/amiga");
    (*((source->super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_Source
      [1])(local_68);
    QVariant::QVariant(&local_48,local_68[0]);
    QSettings::setValue((QString *)(local_90 + 0x18),(QVariant *)local_90);
  }
  else {
    QString::QString((QString *)local_90,"sources/custom");
    (*((source->super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_Source
      [1])(local_68);
    QVariant::QVariant(&local_48,local_68[0]);
    QSettings::setValue((QString *)(local_90 + 0x18),(QVariant *)local_90);
  }
  QVariant::~QVariant(&local_48);
  std::__cxx11::string::~string((string *)local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_90);
  QSettings::sync();
  QSettings::~QSettings((QSettings *)(local_90 + 0x18));
  return;
}

Assistant:

void
FSSDataModel::saveSetting(Data::PSource source) {
  QSettings settings;
  switch (getType(source)) {
    case DataSourceTypeDos:
      settings.setValue("sources/dos", source->get_path().c_str());
      break;
    case DataSourceTypeAmiga:
      settings.setValue("sources/amiga", source->get_path().c_str());
      break;
    case DataSourceTypeCustom:
      settings.setValue("sources/custom", source->get_path().c_str());
      break;
  }
  settings.sync();
}